

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void duckdb::ReservoirQuantileOperation::Destroy<duckdb::ReservoirQuantileState<duckdb::hugeint_t>>
               (ReservoirQuantileState<duckdb::hugeint_t> *state,AggregateInputData *aggr_input_data
               )

{
  void *pvVar1;
  BaseReservoirSampling *in_RSI;
  long *in_RDI;
  
  if (*in_RDI != 0) {
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  if (in_RDI[3] != 0) {
    pvVar1 = (void *)in_RDI[3];
    if (pvVar1 != (void *)0x0) {
      BaseReservoirSampling::~BaseReservoirSampling(in_RSI);
      operator_delete(pvVar1);
    }
    in_RDI[3] = 0;
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &aggr_input_data) {
		if (state.v) {
			free(state.v);
			state.v = nullptr;
		}
		if (state.r_samp) {
			delete state.r_samp;
			state.r_samp = nullptr;
		}
	}